

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_factory.hpp
# Opt level: O0

s2_grid_ptr __thiscall IntegratorXX::S2Factory::generate(S2Factory *this,AngularQuad aq,size_t npts)

{
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  s2_grid_ptr sVar2;
  unique_ptr<IntegratorXX::Womersley<double>,_std::default_delete<IntegratorXX::Womersley<double>_>_>
  local_50;
  unique_ptr<IntegratorXX::LebedevLaikov<double>,_std::default_delete<IntegratorXX::LebedevLaikov<double>_>_>
  local_48;
  unique_ptr<IntegratorXX::Delley<double>,_std::default_delete<IntegratorXX::Delley<double>_>_>
  local_40 [3];
  unique_ptr<IntegratorXX::AhrensBeylkin<double>,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
  local_28;
  size_t local_20;
  size_t npts_local;
  S2Factory *pSStack_10;
  AngularQuad aq_local;
  
  local_20 = npts;
  npts_local._4_4_ = aq;
  pSStack_10 = this;
  if (aq == AhrensBeylkin) {
    std::make_unique<IntegratorXX::AhrensBeylkin<double>,unsigned_long&>((unsigned_long *)&local_28)
    ;
    std::
    shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>>
    ::
    shared_ptr<IntegratorXX::AhrensBeylkin<double>,std::default_delete<IntegratorXX::AhrensBeylkin<double>>,void>
              ((shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>>
                *)this,&local_28);
    std::
    unique_ptr<IntegratorXX::AhrensBeylkin<double>,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
    ::~unique_ptr(&local_28);
    _Var1._M_pi = extraout_RDX;
  }
  else if (aq == Delley) {
    std::make_unique<IntegratorXX::Delley<double>,unsigned_long&>((unsigned_long *)local_40);
    std::
    shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>>
    ::
    shared_ptr<IntegratorXX::Delley<double>,std::default_delete<IntegratorXX::Delley<double>>,void>
              ((shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>>
                *)this,local_40);
    std::
    unique_ptr<IntegratorXX::Delley<double>,_std::default_delete<IntegratorXX::Delley<double>_>_>::
    ~unique_ptr(local_40);
    _Var1._M_pi = extraout_RDX_00;
  }
  else if (aq == LebedevLaikov) {
    std::make_unique<IntegratorXX::LebedevLaikov<double>,unsigned_long&>((unsigned_long *)&local_48)
    ;
    std::
    shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>>
    ::
    shared_ptr<IntegratorXX::LebedevLaikov<double>,std::default_delete<IntegratorXX::LebedevLaikov<double>>,void>
              ((shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>>
                *)this,&local_48);
    std::
    unique_ptr<IntegratorXX::LebedevLaikov<double>,_std::default_delete<IntegratorXX::LebedevLaikov<double>_>_>
    ::~unique_ptr(&local_48);
    _Var1._M_pi = extraout_RDX_01;
  }
  else {
    if (aq != Womersley) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unsupported Angular Quadrature");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::make_unique<IntegratorXX::Womersley<double>,unsigned_long&>((unsigned_long *)&local_50);
    std::
    shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>>
    ::
    shared_ptr<IntegratorXX::Womersley<double>,std::default_delete<IntegratorXX::Womersley<double>>,void>
              ((shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>>
                *)this,&local_50);
    std::
    unique_ptr<IntegratorXX::Womersley<double>,_std::default_delete<IntegratorXX::Womersley<double>_>_>
    ::~unique_ptr(&local_50);
    _Var1._M_pi = extraout_RDX_02;
  }
  sVar2.
  super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  sVar2.
  super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (s2_grid_ptr)
         sVar2.
         super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

S2Factory::s2_grid_ptr S2Factory::generate(AngularQuad aq, size_t npts) {

  switch(aq) {
    case AngularQuad::AhrensBeylkin:
      return std::make_unique<ah_type>(npts);
    case AngularQuad::Delley:
      return std::make_unique<de_type>(npts);
    case AngularQuad::LebedevLaikov:
      return std::make_unique<ll_type>(npts);
    case AngularQuad::Womersley:
      return std::make_unique<wo_type>(npts);
    default:
      throw std::runtime_error("Unsupported Angular Quadrature");
      abort();
  } 
}